

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_end.c
# Opt level: O3

void arg_end_errorfn(void *parent,arg_dstr_t ds,int error,char *argval,char *progname)

{
  char *pcVar1;
  
  if (progname == (char *)0x0) {
    progname = "";
  }
  if (argval == (char *)0x0) {
    argval = "";
  }
  arg_dstr_catf(ds,"%s: ",progname);
  switch(error) {
  case 1:
    pcVar1 = "too many errors to display";
    goto LAB_00107271;
  case 2:
    pcVar1 = "insufficient memory";
LAB_00107271:
    arg_dstr_cat(ds,pcVar1);
    goto LAB_0010728f;
  case 3:
    pcVar1 = "unexpected argument \"%s\"";
    break;
  case 4:
    pcVar1 = "invalid option \"%s\"";
    break;
  case 5:
    pcVar1 = "option \"%s\" requires an argument";
    break;
  default:
    arg_dstr_catf(ds,"invalid option \"-%c\"",(ulong)(uint)error);
    goto LAB_0010728f;
  }
  arg_dstr_catf(ds,pcVar1,argval);
LAB_0010728f:
  arg_dstr_cat(ds,"\n");
  return;
}

Assistant:

static void arg_end_errorfn(void* parent, arg_dstr_t ds, int error, const char* argval, const char* progname) {
    /* suppress unreferenced formal parameter warning */
    (void)parent;

    progname = progname ? progname : "";
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (error) {
        case ARG_ELIMIT:
            arg_dstr_cat(ds, "too many errors to display");
            break;
        case ARG_EMALLOC:
            arg_dstr_cat(ds, "insufficient memory");
            break;
        case ARG_ENOMATCH:
            arg_dstr_catf(ds, "unexpected argument \"%s\"", argval);
            break;
        case ARG_EMISSARG:
            arg_dstr_catf(ds, "option \"%s\" requires an argument", argval);
            break;
        case ARG_ELONGOPT:
            arg_dstr_catf(ds, "invalid option \"%s\"", argval);
            break;
        default:
            arg_dstr_catf(ds, "invalid option \"-%c\"", error);
            break;
    }

    arg_dstr_cat(ds, "\n");
}